

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sz.c
# Opt level: O2

void sz_boot(sc_data_t *sc_data)

{
  int iVar1;
  int i;
  int iVar2;
  int *piVar3;
  ulong uVar4;
  int iVar5;
  size_t dst_ind;
  ulong uVar6;
  long lVar7;
  
  iVar5 = 0;
  for (lVar7 = 0x5c; iVar2 = iVar5, lVar7 != 0x19bc; lVar7 = lVar7 + 0x1c) {
    if (*(char *)((long)sc_data->sc + lVar7 + -0x4c) == '\x01') {
      sz_pind2sz_tab[iVar5] =
           ((long)*(int *)((long)sc_data->sc + lVar7 + -0x50) <<
           (*(byte *)((long)(sc_data->sc + -3) + lVar7) & 0x3f)) +
           (1L << (*(byte *)((long)sc_data->sc + lVar7 + -0x58) & 0x3f));
      iVar5 = iVar5 + 1;
    }
  }
  for (; iVar2 < 200; iVar2 = iVar2 + 1) {
    sz_pind2sz_tab[iVar5] = sc_data->large_maxclass + 0x1000;
  }
  piVar3 = &sc_data->sc[0].ndelta;
  for (lVar7 = 0; lVar7 != 0xe8; lVar7 = lVar7 + 1) {
    sz_index2size_tab[lVar7] =
         ((long)*piVar3 << ((byte)piVar3[-1] & 0x3f)) + (1L << ((byte)piVar3[-2] & 0x3f));
    piVar3 = piVar3 + 7;
  }
  uVar4 = 0;
  uVar6 = 0;
  while ((uVar4 < 0xe8 && (uVar6 < 0x201))) {
    iVar2 = sc_data->sc[uVar4].lg_base;
    iVar1 = sc_data->sc[uVar4].lg_delta;
    iVar5 = sc_data->sc[uVar4].ndelta;
    for (; (uVar6 <= (1L << ((byte)iVar2 & 0x3f)) + ((long)iVar5 << ((byte)iVar1 & 0x3f)) + 7U >> 3
           && (uVar6 < 0x201)); uVar6 = uVar6 + 1) {
      sz_size2index_tab[uVar6] = (uint8_t)uVar4;
    }
    uVar4 = uVar4 + 1;
  }
  return;
}

Assistant:

void
sz_boot(const sc_data_t *sc_data) {
	sz_boot_pind2sz_tab(sc_data);
	sz_boot_index2size_tab(sc_data);
	sz_boot_size2index_tab(sc_data);
}